

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O1

slReturn ubxGetConfig(int fdPort,int verbosity,ubxConfig *config)

{
  ubxMsg pollMsg;
  ubxMsg pollMsg_00;
  ubxMsg pollMsg_01;
  ubxMsg pollMsg_02;
  ubxMsg pollMsg_03;
  ubxMsg pollMsg_04;
  ubxMsg pollMsg_05;
  errInfo error;
  ubxMsg msg_00;
  ubxMsg msg_01;
  ubxMsg msg_02;
  ubxMsg msg_03;
  ubxMsg msg_04;
  ubxMsg msg_05;
  ubxMsg msg_06;
  _Bool _Var1;
  byte bVar2;
  int8_t iVar3;
  uint8_t uVar4;
  ubxChecksum uVar5;
  uint16_t uVar6;
  int16_t iVar7;
  int32_t iVar8;
  uint32_t uVar9;
  slBuffer *psVar10;
  slReturn pvVar11;
  slBuffer *psVar12;
  ubxGNSSConfig *puVar13;
  byte *pbVar14;
  uint64_t uVar15;
  void *pvVar16;
  long lVar17;
  int verbosity_00;
  char *msg_07;
  size_t offset;
  ulong uVar18;
  long lVar19;
  ubxMsg msg;
  ubxMsg nmeaMsg;
  ubxMsg pmsMsg;
  ubxMsg rateMsg;
  ubxMsg tp5Msg;
  ubxMsg nav5Msg;
  ubxMsg gnssMsg;
  ubxMsg antMsg;
  undefined8 local_1d8;
  slBuffer *psVar20;
  undefined2 in_stack_fffffffffffffe38;
  undefined6 in_stack_fffffffffffffe3a;
  undefined6 uVar21;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  int fdPort_00;
  ubxMsg local_1b8;
  ubxMsg local_1a0;
  ubxMsg local_188;
  ubxMsg local_170;
  ubxMsg local_158;
  ubxMsg local_140;
  ubxMsg local_128;
  errorInfo_slReturn local_110;
  errorInfo_slReturn local_f0;
  errorInfo_slReturn local_d0;
  errorInfo_slReturn local_b0;
  errorInfo_slReturn local_90;
  errorInfo_slReturn local_70;
  errorInfo_slReturn local_50;
  
  psVar10 = create_slBuffer(0,LittleEndian);
  local_1d8 = CONCAT62(local_1d8._2_6_,0x1306);
  msg_00.body._0_2_ = in_stack_fffffffffffffe38;
  msg_00._0_8_ = psVar10;
  msg_00.body._2_6_ = in_stack_fffffffffffffe3a;
  msg_00._16_4_ = in_stack_fffffffffffffe40;
  msg_00._20_4_ = in_stack_fffffffffffffe44;
  psVar20 = psVar10;
  uVar5 = calcFletcherChecksum(msg_00);
  pollMsg._18_6_ = in_stack_fffffffffffffe3a;
  pollMsg.checksum = uVar5;
  pollMsg.body = psVar20;
  pollMsg._0_8_ = local_1d8;
  pvVar11 = pollUbx(fdPort,pollMsg,1000,&local_128);
  _Var1 = isErrorReturn(pvVar11);
  if (_Var1) {
    createErrorInfo(&local_50,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c",
                    "ubxGetConfig",0x3e4,pvVar11);
    msg_07 = "problem getting antenna information from GPS";
  }
  else {
    uVar6 = get_uint16_slBuffer(local_128.body,0);
    free(psVar10);
    free(local_128.body);
    uVar18 = (ulong)uVar6;
    _Var1 = isBitSet_slBits(uVar18,0);
    config->antPwr = _Var1;
    _Var1 = isBitSet_slBits(uVar18,1);
    config->antShrtDet = _Var1;
    _Var1 = isBitSet_slBits(uVar18,2);
    config->antOpenDet = _Var1;
    _Var1 = isBitSet_slBits(uVar18,3);
    config->antPwrDwnOnShrt = _Var1;
    _Var1 = isBitSet_slBits(uVar18,4);
    config->antAutoRec = _Var1;
    psVar12 = create_slBuffer(0,LittleEndian);
    local_140.type.class = '\x06';
    local_140.type.id = '>';
    msg_01.body._0_2_ = uVar5;
    msg_01._0_8_ = psVar20;
    msg_01.body._2_6_ = in_stack_fffffffffffffe3a;
    msg_01._16_4_ = in_stack_fffffffffffffe40;
    msg_01._20_4_ = in_stack_fffffffffffffe44;
    local_140.body = psVar12;
    uVar5 = calcFletcherChecksum(msg_01);
    pollMsg_00._2_6_ = local_140._2_6_;
    pollMsg_00.type = local_140.type;
    pollMsg_00._18_6_ = local_140._18_6_;
    pollMsg_00.checksum = uVar5;
    pollMsg_00.body = local_140.body;
    psVar10 = local_140.body;
    local_140.checksum = uVar5;
    pvVar11 = pollUbx(fdPort,pollMsg_00,1000,&local_140);
    _Var1 = isErrorReturn(pvVar11);
    psVar20 = local_140.body;
    if (_Var1) {
      createErrorInfo(&local_70,
                      "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                      ,"ubxGetConfig",0x3f5,pvVar11);
      msg_07 = "problem getting GNSS information from GPS";
      local_50.cause = local_70.cause;
      local_50.fileName = local_70.fileName;
      local_50.functionName = local_70.functionName;
      local_50._24_8_ = local_70._24_8_;
    }
    else {
      bVar2 = get_uint8_slBuffer(local_140.body,1);
      config->trkChnnls = (uint)bVar2;
      bVar2 = get_uint8_slBuffer(psVar20,3);
      config->gnssRecs = (uint)bVar2;
      puVar13 = (ubxGNSSConfig *)safeMalloc((ulong)bVar2 * 0x14);
      config->gnss = puVar13;
      uVar21 = local_140._18_6_;
      if (0 < config->gnssRecs) {
        offset = 10;
        lVar19 = 0;
        lVar17 = 0;
        do {
          bVar2 = get_uint8_slBuffer(psVar20,offset - 6);
          *(uint *)((long)&config->gnss->id + lVar19) = (uint)bVar2;
          bVar2 = get_uint8_slBuffer(psVar20,offset - 5);
          *(uint *)((long)&config->gnss->minChnnls + lVar19) = (uint)bVar2;
          bVar2 = get_uint8_slBuffer(psVar20,offset - 4);
          *(uint *)((long)&config->gnss->maxChnnls + lVar19) = (uint)bVar2;
          bVar2 = get_uint8_slBuffer(psVar20,offset - 2);
          (&config->gnss->enabled)[lVar19] = (_Bool)(bVar2 & 1);
          bVar2 = get_uint8_slBuffer(psVar20,offset);
          *(uint *)((long)&config->gnss->sigConfig + lVar19) = (uint)bVar2;
          lVar17 = lVar17 + 1;
          lVar19 = lVar19 + 0x14;
          offset = offset + 8;
        } while (lVar17 < config->gnssRecs);
      }
      free(psVar12);
      free(psVar20);
      psVar12 = create_slBuffer(0,LittleEndian);
      local_158.type.class = '\x06';
      local_158.type.id = '$';
      msg_02.body._0_2_ = uVar5;
      msg_02._0_8_ = psVar10;
      msg_02.body._2_6_ = uVar21;
      msg_02._16_4_ = in_stack_fffffffffffffe40;
      msg_02._20_4_ = fdPort;
      local_158.body = psVar12;
      uVar5 = calcFletcherChecksum(msg_02);
      pollMsg_01._2_6_ = local_158._2_6_;
      pollMsg_01.type = local_158.type;
      pollMsg_01._18_6_ = local_158._18_6_;
      pollMsg_01.checksum = uVar5;
      pollMsg_01.body = local_158.body;
      psVar10 = local_158.body;
      fdPort_00 = fdPort;
      local_158.checksum = uVar5;
      pvVar11 = pollUbx(fdPort,pollMsg_01,2000,&local_158);
      _Var1 = isErrorReturn(pvVar11);
      psVar20 = local_158.body;
      if (_Var1) {
        createErrorInfo(&local_90,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                        ,"ubxGetConfig",0x40a,pvVar11);
        msg_07 = "problem getting navigation engine information from GPS";
        local_50.cause = local_90.cause;
        local_50.fileName = local_90.fileName;
        local_50.functionName = local_90.functionName;
        local_50._24_8_ = local_90._24_8_;
      }
      else {
        bVar2 = get_uint8_slBuffer(local_158.body,2);
        config->model = (uint)bVar2;
        bVar2 = get_uint8_slBuffer(psVar20,3);
        config->mode = (uint)bVar2;
        iVar8 = get_int32_slBuffer(psVar20,4);
        config->fixedAltM = (double)iVar8 * 0.01;
        iVar8 = get_int32_slBuffer(psVar20,8);
        config->fixedAltVarM2 = (double)iVar8 * 0.0001;
        iVar3 = get_int8_slBuffer(psVar20,0xc);
        config->minElevDeg = (int)iVar3;
        uVar6 = get_uint16_slBuffer(psVar20,0xe);
        config->pDoP = (double)uVar6 * 0.1;
        uVar6 = get_uint16_slBuffer(psVar20,0x10);
        config->tDoP = (double)uVar6 * 0.1;
        uVar6 = get_uint16_slBuffer(psVar20,0x12);
        config->pAccM = uVar6;
        uVar6 = get_uint16_slBuffer(psVar20,0x14);
        config->tAccM = uVar6;
        uVar4 = get_uint8_slBuffer(psVar20,0x16);
        config->staticHoldThreshCmS = uVar4;
        uVar4 = get_uint8_slBuffer(psVar20,0x17);
        config->dgnssTimeoutS = uVar4;
        uVar4 = get_uint8_slBuffer(psVar20,0x18);
        config->cnoThreshNumSVs = uVar4;
        uVar4 = get_uint8_slBuffer(psVar20,0x19);
        config->cnoThreshDbHz = uVar4;
        uVar6 = get_uint16_slBuffer(psVar20,0x1c);
        config->staticHoldMaxDistM = uVar6;
        bVar2 = get_uint8_slBuffer(psVar20,0x1e);
        config->utcStandard = (uint)bVar2;
        free(psVar12);
        free(psVar20);
        psVar12 = create_slBuffer(1,LittleEndian);
        pbVar14 = buffer_slBuffer(psVar12);
        *pbVar14 = '\0';
        local_170.type.class = '\x06';
        local_170.type.id = '1';
        msg_03.body._0_2_ = uVar5;
        msg_03._0_8_ = psVar10;
        msg_03.body._2_6_ = local_158._18_6_;
        msg_03._16_4_ = in_stack_fffffffffffffe40;
        msg_03._20_4_ = fdPort_00;
        local_170.body = psVar12;
        uVar5 = calcFletcherChecksum(msg_03);
        pollMsg_02._2_6_ = local_170._2_6_;
        pollMsg_02.type = local_170.type;
        pollMsg_02._18_6_ = local_170._18_6_;
        pollMsg_02.checksum = uVar5;
        pollMsg_02.body = local_170.body;
        psVar10 = local_170.body;
        local_170.checksum = uVar5;
        pvVar11 = pollUbx(fdPort,pollMsg_02,1000,&local_170);
        _Var1 = isErrorReturn(pvVar11);
        psVar20 = local_170.body;
        if (_Var1) {
          createErrorInfo(&local_b0,
                          "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                          ,"ubxGetConfig",0x425,pvVar11);
          msg_07 = "problem getting time pulse information from GPS";
          local_50.cause = local_b0.cause;
          local_50.fileName = local_b0.fileName;
          local_50.functionName = local_b0.functionName;
          local_50._24_8_ = local_b0._24_8_;
        }
        else {
          iVar7 = get_int16_slBuffer(local_170.body,4);
          config->antCableDelayNs = iVar7;
          iVar7 = get_int16_slBuffer(psVar20,6);
          config->rfGroupDelayNs = iVar7;
          uVar9 = get_uint32_slBuffer(psVar20,8);
          config->freqPeriod = uVar9;
          uVar9 = get_uint32_slBuffer(psVar20,0xc);
          config->freqPeriodLock = uVar9;
          uVar9 = get_uint32_slBuffer(psVar20,0x10);
          config->pulseLenRatio = uVar9;
          uVar9 = get_uint32_slBuffer(psVar20,0x14);
          config->pulseLenRatioLock = uVar9;
          iVar8 = get_int32_slBuffer(psVar20,0x18);
          config->userConfigDelay = iVar8;
          uVar9 = get_uint32_slBuffer(psVar20,0x1c);
          uVar18 = (ulong)uVar9;
          _Var1 = isBitSet_slBits(uVar18,0);
          config->timePulse0Enabled = _Var1;
          _Var1 = isBitSet_slBits(uVar18,1);
          config->lockGpsFreq = _Var1;
          _Var1 = isBitSet_slBits(uVar18,2);
          config->lockedOtherSet = _Var1;
          _Var1 = isBitSet_slBits(uVar18,3);
          config->isFreq = _Var1;
          _Var1 = isBitSet_slBits(uVar18,4);
          config->isLength = _Var1;
          _Var1 = isBitSet_slBits(uVar18,5);
          config->alignToTow = _Var1;
          _Var1 = isBitSet_slBits(uVar18,6);
          config->polarity = _Var1;
          uVar15 = getBitField_slBits(uVar18,0x780);
          config->gridUtcTnss = (timegridType)uVar15;
          free(psVar12);
          free(psVar20);
          psVar12 = create_slBuffer(0,LittleEndian);
          local_188.type.class = '\x06';
          local_188.type.id = '\b';
          msg_04.body._0_2_ = uVar5;
          msg_04._0_8_ = psVar10;
          msg_04.body._2_6_ = local_170._18_6_;
          msg_04._16_4_ = in_stack_fffffffffffffe40;
          msg_04._20_4_ = fdPort_00;
          local_188.body = psVar12;
          uVar5 = calcFletcherChecksum(msg_04);
          pollMsg_03._2_6_ = local_188._2_6_;
          pollMsg_03.type = local_188.type;
          pollMsg_03._18_6_ = local_188._18_6_;
          pollMsg_03.checksum = uVar5;
          pollMsg_03.body = local_188.body;
          psVar10 = local_188.body;
          local_188.checksum = uVar5;
          pvVar11 = pollUbx(fdPort,pollMsg_03,1000,&local_188);
          _Var1 = isErrorReturn(pvVar11);
          psVar20 = local_188.body;
          if (_Var1) {
            createErrorInfo(&local_d0,
                            "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                            ,"ubxGetConfig",0x440,pvVar11);
            msg_07 = "problem getting fix rate information from GPS";
            local_50.cause = local_d0.cause;
            local_50.fileName = local_d0.fileName;
            local_50.functionName = local_d0.functionName;
            local_50._24_8_ = local_d0._24_8_;
          }
          else {
            uVar6 = get_uint16_slBuffer(local_188.body,0);
            config->measRateMs = uVar6;
            uVar6 = get_uint16_slBuffer(psVar20,2);
            config->navRate = uVar6;
            uVar6 = get_uint16_slBuffer(psVar20,4);
            config->timeRef = (uint)uVar6;
            free(psVar12);
            free(psVar20);
            psVar12 = create_slBuffer(0,LittleEndian);
            local_1a0.type.class = '\x06';
            local_1a0.type.id = 0x86;
            msg_05.body._0_2_ = uVar5;
            msg_05._0_8_ = psVar10;
            msg_05.body._2_6_ = local_188._18_6_;
            msg_05._16_4_ = in_stack_fffffffffffffe40;
            msg_05._20_4_ = fdPort_00;
            local_1a0.body = psVar12;
            uVar5 = calcFletcherChecksum(msg_05);
            pollMsg_04._2_6_ = local_1a0._2_6_;
            pollMsg_04.type = local_1a0.type;
            pollMsg_04._18_6_ = local_1a0._18_6_;
            pollMsg_04.checksum = uVar5;
            pollMsg_04.body = local_1a0.body;
            psVar10 = local_1a0.body;
            local_1a0.checksum = uVar5;
            pvVar11 = pollUbx(fdPort,pollMsg_04,1000,&local_1a0);
            _Var1 = isErrorReturn(pvVar11);
            psVar20 = local_1a0.body;
            if (_Var1) {
              createErrorInfo(&local_f0,
                              "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                              ,"ubxGetConfig",0x44e,pvVar11);
              msg_07 = "problem getting power mode information from GPS";
              local_50.cause = local_f0.cause;
              local_50.fileName = local_f0.fileName;
              local_50.functionName = local_f0.functionName;
              local_50._24_8_ = local_f0._24_8_;
            }
            else {
              bVar2 = get_uint8_slBuffer(local_1a0.body,1);
              config->powerSetup = (uint)bVar2;
              uVar6 = get_uint16_slBuffer(psVar20,2);
              config->powerIntervalSecs = uVar6;
              uVar6 = get_uint16_slBuffer(psVar20,4);
              config->powerOnTimeSecs = uVar6;
              free(psVar12);
              free(psVar20);
              pvVar11 = isNmeaOn(fdPort);
              _Var1 = isErrorReturn(pvVar11);
              if (_Var1) {
                return pvVar11;
              }
              pvVar16 = getReturnInfo(pvVar11);
              config->nmeaEnabled = pvVar16 != (void *)0x0;
              psVar12 = create_slBuffer(0,LittleEndian);
              local_1b8.type.class = '\x06';
              local_1b8.type.id = '\x17';
              msg_06.body._0_2_ = uVar5;
              msg_06._0_8_ = psVar10;
              msg_06.body._2_6_ = local_1a0._18_6_;
              msg_06._16_4_ = in_stack_fffffffffffffe40;
              msg_06._20_4_ = fdPort_00;
              local_1b8.body = psVar12;
              local_1b8.checksum = calcFletcherChecksum(msg_06);
              pollMsg_05._2_6_ = local_1b8._2_6_;
              pollMsg_05.type = local_1b8.type;
              pollMsg_05._18_6_ = local_1b8._18_6_;
              pollMsg_05.checksum = local_1b8.checksum;
              pollMsg_05.body = local_1b8.body;
              pvVar11 = pollUbx(fdPort,pollMsg_05,1000,&local_1b8);
              _Var1 = isErrorReturn(pvVar11);
              psVar20 = local_1b8.body;
              if (!_Var1) {
                verbosity_00 = 1;
                uVar4 = get_uint8_slBuffer(local_1b8.body,1);
                config->nmeaVersion = uVar4;
                free(psVar12);
                free(psVar20);
                pvVar11 = isNMEAmsgEnabled(fdPort,verbosity_00,GGA);
                _Var1 = isErrorReturn(pvVar11);
                if (_Var1) {
                  return pvVar11;
                }
                pvVar16 = getReturnInfo(pvVar11);
                config->GGA = pvVar16 != (void *)0x0;
                pvVar11 = isNMEAmsgEnabled(fdPort,verbosity_00,GLL);
                _Var1 = isErrorReturn(pvVar11);
                if (_Var1) {
                  return pvVar11;
                }
                pvVar16 = getReturnInfo(pvVar11);
                config->GLL = pvVar16 != (void *)0x0;
                pvVar11 = isNMEAmsgEnabled(fdPort,verbosity_00,GSA);
                _Var1 = isErrorReturn(pvVar11);
                if (_Var1) {
                  return pvVar11;
                }
                pvVar16 = getReturnInfo(pvVar11);
                config->GSA = pvVar16 != (void *)0x0;
                pvVar11 = isNMEAmsgEnabled(fdPort,verbosity_00,GSV);
                _Var1 = isErrorReturn(pvVar11);
                if (_Var1) {
                  return pvVar11;
                }
                pvVar16 = getReturnInfo(pvVar11);
                config->GSV = pvVar16 != (void *)0x0;
                pvVar11 = isNMEAmsgEnabled(fdPort,verbosity_00,RMC);
                _Var1 = isErrorReturn(pvVar11);
                if (_Var1) {
                  return pvVar11;
                }
                pvVar16 = getReturnInfo(pvVar11);
                config->RMC = pvVar16 != (void *)0x0;
                pvVar11 = isNMEAmsgEnabled(fdPort,verbosity_00,VTG);
                _Var1 = isErrorReturn(pvVar11);
                if (_Var1) {
                  return pvVar11;
                }
                pvVar16 = getReturnInfo(pvVar11);
                config->VTG = pvVar16 != (void *)0x0;
                pvVar11 = isNMEAmsgEnabled(fdPort,verbosity_00,GRS);
                _Var1 = isErrorReturn(pvVar11);
                if (_Var1) {
                  return pvVar11;
                }
                pvVar16 = getReturnInfo(pvVar11);
                config->GRS = pvVar16 != (void *)0x0;
                pvVar11 = isNMEAmsgEnabled(fdPort_00,verbosity_00,GST);
                _Var1 = isErrorReturn(pvVar11);
                if (_Var1) {
                  return pvVar11;
                }
                pvVar16 = getReturnInfo(pvVar11);
                config->GST = pvVar16 != (void *)0x0;
                pvVar11 = isNMEAmsgEnabled(fdPort_00,verbosity_00,ZDA);
                _Var1 = isErrorReturn(pvVar11);
                if (_Var1) {
                  return pvVar11;
                }
                pvVar16 = getReturnInfo(pvVar11);
                config->ZDA = pvVar16 != (void *)0x0;
                pvVar11 = makeOkReturn();
                return pvVar11;
              }
              createErrorInfo(&local_110,
                              "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                              ,"ubxGetConfig",0x462,pvVar11);
              msg_07 = "problem getting NMEA Version information from GPS";
              local_50.cause = local_110.cause;
              local_50.fileName = local_110.fileName;
              local_50.functionName = local_110.functionName;
              local_50._24_8_ = local_110._24_8_;
            }
          }
        }
      }
    }
  }
  error.fileName = local_50.fileName;
  error.cause = local_50.cause;
  error.functionName = local_50.functionName;
  error.lineNumber = local_50.lineNumber;
  error._28_4_ = local_50._28_4_;
  pvVar11 = makeErrorMsgReturn(error,msg_07);
  return pvVar11;
}

Assistant:

extern slReturn ubxGetConfig(int fdPort, int verbosity, ubxConfig* config) {

    // get the antenna configuration...
    ubxType antType = { UBX_CFG, UBX_CFG_ANT };
    slBuffer* body = create_slBuffer(0, LittleEndian);
    ubxMsg msg = createUbxMsg(antType, body);
    ubxMsg antMsg;
    slReturn antResp = pollUbx(fdPort, msg, CFG_ANT_MAX_MS, &antMsg);
    if (isErrorReturn(antResp))
        return makeErrorMsgReturn(ERR_CAUSE(antResp), "problem getting antenna information from GPS");
    uint16_t antMask = get_uint16_slBuffer(antMsg.body, 0);
    free(body);
    free(antMsg.body);
    config->antPwr          = isBitSet_slBits(antMask, 0);
    config->antShrtDet      = isBitSet_slBits(antMask, 1);
    config->antOpenDet      = isBitSet_slBits(antMask, 2);
    config->antPwrDwnOnShrt = isBitSet_slBits(antMask, 3);
    config->antAutoRec      = isBitSet_slBits(antMask, 4);

    // get the GNSS configuration...
    ubxType gnssType = { UBX_CFG, UBX_CFG_GNSS };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(gnssType, body);
    ubxMsg gnssMsg;
    slReturn gnssResp = pollUbx(fdPort, msg, CFG_GNSS_MAX_MS, &gnssMsg);
    if (isErrorReturn(gnssResp))
        return makeErrorMsgReturn(ERR_CAUSE(gnssResp), "problem getting GNSS information from GPS");
    config->trkChnnls = get_uint8_slBuffer(gnssMsg.body, 1);
    config->gnssRecs = get_uint8_slBuffer(gnssMsg.body, 3);  // number of configuration blocks...
    config->gnss = safeMalloc(sizeof(ubxGNSSConfig) * config->gnssRecs);
    for (int i = 0; i < config->gnssRecs; i++) {
        config->gnss[i].id        = (gnssID) get_uint8_slBuffer(gnssMsg.body,  4 + 8 * (size_t)i);
        config->gnss[i].minChnnls =          get_uint8_slBuffer(gnssMsg.body,  5 + 8 * (size_t)i);
        config->gnss[i].maxChnnls =          get_uint8_slBuffer(gnssMsg.body,  6 + 8 * (size_t)i);
        config->gnss[i].enabled   = (bool)  (get_uint8_slBuffer(gnssMsg.body,  8 + 8 * (size_t)i) & 0x01);
        config->gnss[i].sigConfig =          get_uint8_slBuffer(gnssMsg.body, 10 + 8 * (size_t)i);
    }
    free(body);
    free(gnssMsg.body);

    // get the navigation engine configuration...
    ubxType nav5Type = { UBX_CFG, UBX_CFG_NAV5 };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(nav5Type, body);
    ubxMsg nav5Msg;
    slReturn nav5Resp = pollUbx(fdPort, msg, CFG_NAV5_MAX_MS, &nav5Msg);
    if (isErrorReturn(nav5Resp))
        return makeErrorMsgReturn(ERR_CAUSE(nav5Resp), "problem getting navigation engine information from GPS");
    config->model               = (dynModel) get_uint8_slBuffer(nav5Msg.body,  2);
    config->mode                = (fixMode)  get_uint8_slBuffer(nav5Msg.body,  3);
    config->fixedAltM           = 0.01 *     get_int32_slBuffer(nav5Msg.body,  4);
    config->fixedAltVarM2       = 0.0001 *   get_int32_slBuffer(nav5Msg.body,  8);
    config->minElevDeg          =            get_int8_slBuffer(nav5Msg.body, 12);
    config->pDoP                = 0.1 *      get_uint16_slBuffer(nav5Msg.body, 14);
    config->tDoP                = 0.1 *      get_uint16_slBuffer(nav5Msg.body, 16);
    config->pAccM               =            get_uint16_slBuffer(nav5Msg.body, 18);
    config->tAccM               =            get_uint16_slBuffer(nav5Msg.body, 20);
    config->staticHoldThreshCmS =            get_uint8_slBuffer(nav5Msg.body, 22);
    config->dgnssTimeoutS       =            get_uint8_slBuffer(nav5Msg.body, 23);
    config->cnoThreshNumSVs     =            get_uint8_slBuffer(nav5Msg.body, 24);
    config->cnoThreshDbHz       =            get_uint8_slBuffer(nav5Msg.body, 25);
    config->staticHoldMaxDistM  =            get_uint16_slBuffer(nav5Msg.body, 28);
    config->utcStandard         = (utcType)  get_uint8_slBuffer(nav5Msg.body, 30);
    free(body);
    free(nav5Msg.body);

    // get the time pulse configuration...
    ubxType tp5Type = { UBX_CFG, UBX_CFG_TP5 };
    body = create_slBuffer(1, LittleEndian);
    *buffer_slBuffer(body) = 0;  // we only look at time pulse zero...
    msg = createUbxMsg(tp5Type, body);
    ubxMsg tp5Msg;
    slReturn tp5Resp = pollUbx(fdPort, msg, CFG_TP5_MAX_MS, &tp5Msg);
    if (isErrorReturn(tp5Resp))
        return makeErrorMsgReturn(ERR_CAUSE(tp5Resp), "problem getting time pulse information from GPS");
    config->antCableDelayNs   = get_int16_slBuffer(tp5Msg.body,  4);
    config->rfGroupDelayNs    = get_int16_slBuffer(tp5Msg.body,  6);
    config->freqPeriod        = get_uint32_slBuffer(tp5Msg.body,  8);
    config->freqPeriodLock    = get_uint32_slBuffer(tp5Msg.body, 12);
    config->pulseLenRatio     = get_uint32_slBuffer(tp5Msg.body, 16);
    config->pulseLenRatioLock = get_uint32_slBuffer(tp5Msg.body, 20);
    config->userConfigDelay   = get_int32_slBuffer(tp5Msg.body, 24);
    uint32_t flags            = get_uint32_slBuffer(tp5Msg.body, 28);
    config->timePulse0Enabled = isBitSet_slBits(flags, 0);
    config->lockGpsFreq      = isBitSet_slBits(flags, 1);
    config->lockedOtherSet    = isBitSet_slBits(flags, 2);
    config->isFreq            = isBitSet_slBits(flags, 3);
    config->isLength          = isBitSet_slBits(flags, 4);
    config->alignToTow        = isBitSet_slBits(flags, 5);
    config->polarity          = isBitSet_slBits(flags, 6);
    config->gridUtcTnss       = (timegridType) getBitField_slBits(flags, 0x000000780);
    free(body);
    free(tp5Msg.body);

    // get the fix rate configuration...
    ubxType rateType = { UBX_CFG, UBX_CFG_RATE };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(rateType, body);
    ubxMsg rateMsg;
    slReturn rateResp = pollUbx(fdPort, msg, CFG_RATE_MAX_MS, &rateMsg);
    if (isErrorReturn(rateResp))
        return makeErrorMsgReturn(ERR_CAUSE(rateResp), "problem getting fix rate information from GPS");
    config->measRateMs =                  get_uint16_slBuffer(rateMsg.body, 0);
    config->navRate    =                  get_uint16_slBuffer(rateMsg.body, 2);
    config->timeRef    = (fixTimeRefType) get_uint16_slBuffer(rateMsg.body, 4);
    free(body);
    free(rateMsg.body);

    // get the power mode configuration...
    ubxType pmsType = { UBX_CFG, UBX_CFG_PMS };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(pmsType, body);
    ubxMsg pmsMsg;
    slReturn pmsResp = pollUbx(fdPort, msg, CFG_PMS_MAX_MS, &pmsMsg);
    if (isErrorReturn(pmsResp))
        return makeErrorMsgReturn(ERR_CAUSE(pmsResp), "problem getting power mode information from GPS");
    config->powerSetup        = (powerModeType) get_uint8_slBuffer(pmsMsg.body, 1);
    config->powerIntervalSecs =                 get_uint16_slBuffer(pmsMsg.body, 2);
    config->powerOnTimeSecs   =                 get_uint16_slBuffer(pmsMsg.body, 4);
    free(body);
    free(pmsMsg.body);

    // get the NMEA configuration...
    // is NMEA enabled?
    slReturn cn = isNmeaOn(fdPort);
    if (isErrorReturn(cn)) return cn;
    config->nmeaEnabled = getReturnInfoBool(cn);

    // get NMEA Version
    ubxType nmeaType = { UBX_CFG, UBX_CFG_NMEA };
    body = create_slBuffer(0, LittleEndian);
    msg = createUbxMsg(nmeaType, body);
    ubxMsg nmeaMsg;
    slReturn nmeaResp = pollUbx(fdPort, msg, CFG_NMEA_MAX_MS, &nmeaMsg);
    if (isErrorReturn(nmeaResp))
        return makeErrorMsgReturn(ERR_CAUSE(nmeaResp), "problem getting NMEA Version information from GPS");
    config->nmeaVersion        = get_uint8_slBuffer(nmeaMsg.body, 1);
    free(body);
    free(nmeaMsg.body);

    // Get NMEA sentence config
    cn = isNMEAmsgEnabled(fdPort, verbosity, GGA);
    if (isErrorReturn(cn)) return cn;
    config->GGA = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GLL);
    if (isErrorReturn(cn)) return cn;
    config->GLL = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GSA);
    if (isErrorReturn(cn)) return cn;
    config->GSA = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GSV);
    if (isErrorReturn(cn)) return cn;
    config->GSV = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, RMC);
    if (isErrorReturn(cn)) return cn;
    config->RMC = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, VTG);
    if (isErrorReturn(cn)) return cn;
    config->VTG = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GRS);
    if (isErrorReturn(cn)) return cn;
    config->GRS = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, GST);
    if (isErrorReturn(cn)) return cn;
    config->GST = getReturnInfoBool(cn);
    cn = isNMEAmsgEnabled(fdPort, verbosity, ZDA);
    if (isErrorReturn(cn)) return cn;
    config->ZDA = getReturnInfoBool(cn);

    return makeOkReturn();
}